

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

FilePathSpecSyntax * __thiscall slang::parsing::Parser::parseFilePathSpec(Parser *this)

{
  BumpAllocator *pBVar1;
  string_view rawText;
  bool bVar2;
  int iVar3;
  SourceLocation SVar4;
  undefined4 extraout_var;
  FilePathSpecSyntax *pFVar5;
  size_t extraout_RDX;
  EVP_PKEY_CTX *ctx;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar6;
  Token path;
  Token first;
  anon_class_8_1_8991fb9c nextIsValidPathToken;
  Token local_88;
  string_view local_78;
  SmallVector<char,_40UL> text;
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,StringLiteral);
  if (bVar2) {
    text.super_SmallVectorBase<char>._0_16_ = ParserBase::consume(&this->super_ParserBase);
    pBVar1 = (this->super_ParserBase).alloc;
    sVar6 = Token::trivia((Token *)&text);
    local_78 = Token::rawText((Token *)&text);
    SVar4 = Token::location((Token *)&text);
    Token::Token(&first,pBVar1,IncludeFileName,sVar6,local_78,SVar4);
  }
  else {
    nextIsValidPathToken.this = this;
    bVar2 = parseFilePathSpec::anon_class_8_1_8991fb9c::operator()(&nextIsValidPathToken);
    if (bVar2) {
      text.super_SmallVectorBase<char>.len = 0;
      text.super_SmallVectorBase<char>.data_ = text.super_SmallVectorBase<char>.firstElement;
      text.super_SmallVectorBase<char>.cap = 0x28;
      first.kind._0_1_ = 0x22;
      SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&first);
      first = ParserBase::peek(&this->super_ParserBase);
      do {
        local_88 = ParserBase::consume(&this->super_ParserBase);
        path = (Token)Token::rawText(&local_88);
        SmallVectorBase<char>::append_range<std::basic_string_view<char,_std::char_traits<char>_>_>
                  (&text.super_SmallVectorBase<char>,
                   (basic_string_view<char,_std::char_traits<char>_> *)&path);
        bVar2 = parseFilePathSpec::anon_class_8_1_8991fb9c::operator()(&nextIsValidPathToken);
        if (!bVar2) break;
        path = ParserBase::peek(&this->super_ParserBase);
        sVar6 = Token::trivia(&path);
      } while (sVar6._M_extent._M_extent_value._M_extent_value == 0);
      path.kind._0_1_ = 0x22;
      SmallVectorBase<char>::emplace_back<char>(&text.super_SmallVectorBase<char>,(char *)&path);
      pBVar1 = (this->super_ParserBase).alloc;
      sVar6 = Token::trivia(&first);
      iVar3 = SmallVectorBase<char>::copy
                        (&text.super_SmallVectorBase<char>,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                         (EVP_PKEY_CTX *)sVar6._M_extent._M_extent_value._M_extent_value);
      rawText._M_str._4_4_ = extraout_var;
      rawText._M_str._0_4_ = iVar3;
      SVar4 = Token::location(&first);
      rawText._M_len = extraout_RDX;
      Token::Token(&path,pBVar1,IncludeFileName,sVar6,rawText,SVar4);
      ctx = (EVP_PKEY_CTX *)path._0_8_;
      pFVar5 = slang::syntax::SyntaxFactory::filePathSpec(&this->factory,path);
      SmallVectorBase<char>::cleanup(&text.super_SmallVectorBase<char>,ctx);
      return pFVar5;
    }
    first = ParserBase::expect(&this->super_ParserBase,IncludeFileName);
  }
  pFVar5 = slang::syntax::SyntaxFactory::filePathSpec(&this->factory,first);
  return pFVar5;
}

Assistant:

FilePathSpecSyntax& Parser::parseFilePathSpec() {
    if (peek(TokenKind::StringLiteral)) {
        auto lit = consume();
        auto path = Token(alloc, TokenKind::IncludeFileName, lit.trivia(), lit.rawText(),
                          lit.location());
        return factory.filePathSpec(path);
    }

    auto nextIsValidPathToken = [&] {
        switch (peek().kind) {
            case TokenKind::Minus:
                return peek(1).kind != TokenKind::IncDirKeyword;
            case TokenKind::Comma:
            case TokenKind::Semicolon:
            case TokenKind::EndOfFile:
                return false;
            default:
                return true;
        }
    };

    if (!nextIsValidPathToken())
        return factory.filePathSpec(expect(TokenKind::IncludeFileName));

    SmallVector<char> text;
    text.push_back('"');

    auto first = peek();
    do {
        text.append_range(consume().rawText());
    } while (nextIsValidPathToken() && peek().trivia().empty());

    text.push_back('"');

    auto path = Token(alloc, TokenKind::IncludeFileName, first.trivia(),
                      toStringView(text.copy(alloc)), first.location());
    return factory.filePathSpec(path);
}